

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

void ModActorFlag(AActor *actor,FFlagDef *fd,bool set)

{
  long lVar1;
  uint uVar2;
  undefined3 in_register_00000011;
  
  lVar1 = (long)fd->structoffset;
  if (CONCAT31(in_register_00000011,set) == 0) {
    uVar2 = ~fd->flagbit &
            *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar1);
  }
  else {
    uVar2 = fd->flagbit |
            *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar1);
  }
  *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar1) = uVar2;
  return;
}

Assistant:

void ModActorFlag(AActor *actor, FFlagDef *fd, bool set)
{
	// Little-Endian machines only need one case, because all field sizes
	// start at the same address. (Unless the machine has unaligned access
	// exceptions, in which case you'll need multiple cases for it too.)
#ifdef __BIG_ENDIAN__
	if (fd->fieldsize == 4)
#endif
	{
		DWORD *flagvar = (DWORD *)((char *)actor + fd->structoffset);
		if (set)
		{
			*flagvar |= fd->flagbit;
		}
		else
		{
			*flagvar &= ~fd->flagbit;
		}
	}
#ifdef __BIG_ENDIAN__
	else if (fd->fieldsize == 2)
	{
		WORD *flagvar = (WORD *)((char *)actor + fd->structoffset);
		if (set)
		{
			*flagvar |= fd->flagbit;
		}
		else
		{
			*flagvar &= ~fd->flagbit;
		}
	}
	else
	{
		assert(fd->fieldsize == 1);
		BYTE *flagvar = (BYTE *)((char *)actor + fd->structoffset);
		if (set)
		{
			*flagvar |= fd->flagbit;
		}
		else
		{
			*flagvar &= ~fd->flagbit;
		}
	}
#endif
}